

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write(uv_stream_t *stream)

{
  void *pvVar1;
  int iVar2;
  uv_write_t *req_00;
  size_t n_00;
  ssize_t n;
  uv_write_t *req;
  QUEUE *q;
  uv_stream_t *stream_local;
  
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                  ,0x37a,"void uv__write(uv_stream_t *)");
  }
  do {
    if (stream->write_queue == (void **)stream->write_queue[0]) {
      return;
    }
    pvVar1 = stream->write_queue[0];
    req_00 = (uv_write_t *)((long)pvVar1 + -0x58);
    if (*(uv_stream_t **)((long)pvVar1 + -8) != stream) {
      __assert_fail("req->handle == stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                    ,0x382,"void uv__write(uv_stream_t *)");
    }
    iVar2 = uv__try_write(stream,(uv_buf_t *)
                                 (*(long *)((long)pvVar1 + 0x18) +
                                 (ulong)*(uint *)((long)pvVar1 + 0x10) * 0x10),
                          *(int *)((long)pvVar1 + 0x20) - *(int *)((long)pvVar1 + 0x10),
                          *(uv_stream_t **)((long)pvVar1 + -0x10));
    n_00 = (size_t)iVar2;
    if ((long)n_00 < 0) {
      if (n_00 != 0xfffffffffffffff5) {
        *(int *)((long)pvVar1 + 0x24) = iVar2;
        uv__write_req_finish(req_00);
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        uv__stream_osx_interrupt_select(stream);
        return;
      }
    }
    else {
      *(undefined8 *)((long)pvVar1 + -0x10) = 0;
      iVar2 = uv__write_req_update(stream,req_00,n_00);
      if (iVar2 != 0) {
        uv__write_req_finish(req_00);
        return;
      }
    }
  } while ((stream->flags & 0x100000) != 0);
  uv__io_start(stream->loop,&stream->io_watcher,4);
  uv__stream_osx_interrupt_select(stream);
  return;
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  QUEUE* q;
  uv_write_t* req;
  ssize_t n;

  assert(uv__stream_fd(stream) >= 0);

  for (;;) {
    if (QUEUE_EMPTY(&stream->write_queue))
      return;

    q = QUEUE_HEAD(&stream->write_queue);
    req = QUEUE_DATA(q, uv_write_t, queue);
    assert(req->handle == stream);

    n = uv__try_write(stream,
                      &(req->bufs[req->write_index]),
                      req->nbufs - req->write_index,
                      req->send_handle);

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0) {
      req->send_handle = NULL;
      if (uv__write_req_update(stream, req, n)) {
        uv__write_req_finish(req);
        return;  /* TODO(bnoordhuis) Start trying to write the next request. */
      }
    } else if (n != UV_EAGAIN)
      break;

    /* If this is a blocking stream, try again. */
    if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
      continue;

    /* We're not done. */
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

    /* Notify select() thread about state change */
    uv__stream_osx_interrupt_select(stream);

    return;
  }

  req->error = n;
  // XXX(jwn): this must call uv__stream_flush_write_queue(stream, n) here, since we won't generate any more events
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);
}